

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O1

bool __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DecoderBuffer *buffer)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = buffer->pos_ + 4;
  if (lVar3 <= buffer->data_size_) {
    uVar2 = *(uint *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar3;
    lVar3 = buffer->pos_ + 4;
    if ((lVar3 <= buffer->data_size_) && (buffer->pos_ = lVar3, (uVar2 & 1) != 0)) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
      if (uVar1 - 2 < 0x1d) {
        uVar4 = -1 << (-(char)uVar1 & 0x1fU);
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        quantization_bits_ = 0x20 - uVar1;
        uVar2 = -uVar4 - 2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        max_quantized_value_ = ~uVar4;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_value_ =
             uVar2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        dequantization_scale_ = 2.0 / (float)(int)uVar2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.center_value_
             = uVar2 >> 1;
        return 0x1e - uVar1 < 0x1d;
      }
    }
  }
  return false;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }